

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

int CivetServer::getCookie(mg_connection *conn,string *cookieName,string *cookieValue)

{
  int iVar1;
  char *cookie_header;
  char *var_name;
  int lRead;
  char *cookie;
  char _cookieValue [4096];
  string *cookieValue_local;
  string *cookieName_local;
  mg_connection *conn_local;
  
  cookie_header = mg_get_header(conn,"Cookie");
  var_name = (char *)std::__cxx11::string::c_str();
  iVar1 = mg_get_cookie(cookie_header,var_name,(char *)&cookie,0x1000);
  std::__cxx11::string::clear();
  if (-1 < iVar1) {
    std::__cxx11::string::append((char *)cookieValue);
  }
  return iVar1;
}

Assistant:

int
CivetServer::getCookie(struct mg_connection *conn,
                       const std::string &cookieName,
                       std::string &cookieValue)
{
	// Maximum cookie length as per microsoft is 4096.
	// http://msdn.microsoft.com/en-us/library/ms178194.aspx
	char _cookieValue[4096];
	const char *cookie = mg_get_header(conn, "Cookie");
	int lRead = mg_get_cookie(cookie,
	                          cookieName.c_str(),
	                          _cookieValue,
	                          sizeof(_cookieValue));
	cookieValue.clear();
	if (lRead >= 0) {
		cookieValue.append(_cookieValue);
	}
	return lRead;
}